

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

handle pybind11::detail::type_caster_generic::cast
                 (void *_src,return_value_policy policy,handle parent,type_info *tinfo,
                 _func_void_ptr_void_ptr *copy_constructor,_func_void_ptr_void_ptr *move_constructor
                 ,void *existing_holder)

{
  pointer pptVar1;
  PyObject *pPVar2;
  bool bVar3;
  byte bVar4;
  internals *piVar5;
  _Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false> _Var6;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *pvVar7;
  handle hVar8;
  void *pvVar9;
  cast_error *pcVar10;
  _func_void_ptr_void_ptr *p_Var11;
  _Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false> it_i;
  string *this;
  pointer pptVar12;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  pVar13;
  void *src;
  object inst;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [2];
  handle local_90;
  _func_void_ptr_void_ptr *local_88;
  string type_name;
  void **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (tinfo == (type_info *)0x0) {
    return (handle)(PyObject *)0x0;
  }
  src = _src;
  if (_src == (void *)0x0) {
    __Py_NoneStruct = __Py_NoneStruct + 1;
    this = &type_name;
    hVar8.m_ptr = (PyObject *)&_Py_NoneStruct;
    goto LAB_0024058e;
  }
  local_90.m_ptr = parent.m_ptr;
  local_88 = move_constructor;
  piVar5 = get_internals();
  pVar13 = std::
           _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
           ::equal_range(&(piVar5->registered_instances)._M_h,&src);
  for (_Var6._M_cur = (__node_type *)
                      pVar13.first.
                      super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                      ._M_cur;
      (_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>)
      _Var6._M_cur !=
      pVar13.second.
      super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>.
      _M_cur.
      super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>;
      _Var6._M_cur = (__node_type *)((_Var6._M_cur)->super__Hash_node_base)._M_nxt) {
    pvVar7 = all_type_info(*(PyTypeObject **)
                            (*(long *)((long)&((_Var6._M_cur)->
                                              super__Hash_node_value<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                                              ).
                                              super__Hash_node_value_base<std::pair<const_void_*const,_pybind11::detail::instance_*>_>
                                              ._M_storage._M_storage + 8) + 8));
    pptVar1 = (pvVar7->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (pptVar12 = (pvVar7->
                    super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                    )._M_impl.super__Vector_impl_data._M_start; pptVar12 != pptVar1;
        pptVar12 = pptVar12 + 1) {
      if ((*pptVar12 != (type_info *)0x0) &&
         (bVar3 = std::type_info::operator==((*pptVar12)->cpptype,tinfo->cpptype), bVar3)) {
        pPVar2 = *(PyObject **)
                  ((long)&((_Var6._M_cur)->
                          super__Hash_node_value<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                          ).
                          super__Hash_node_value_base<std::pair<const_void_*const,_pybind11::detail::instance_*>_>
                          ._M_storage._M_storage + 8);
        if (pPVar2 == (PyObject *)0x0) {
          return (handle)(PyObject *)0x0;
        }
        pPVar2->ob_refcnt = pPVar2->ob_refcnt + 1;
        return (handle)pPVar2;
      }
    }
  }
  hVar8.m_ptr = make_new_instance(tinfo->type);
  *(byte *)&hVar8.m_ptr[3].ob_refcnt = (byte)hVar8.m_ptr[3].ob_refcnt & 0xfe;
  inst.super_handle.m_ptr = (handle)(handle)hVar8.m_ptr;
  local_b0[0]._0_8_ = hVar8.m_ptr;
  local_b0[0]._8_8_ = all_type_info((hVar8.m_ptr)->ob_type);
  values_and_holders::begin((iterator *)&type_name,(values_and_holders *)local_b0);
  switch(policy) {
  case automatic:
  case take_ownership:
    pvVar9 = src;
    break;
  case automatic_reference:
  case reference:
    *local_58 = src;
    bVar4 = (byte)hVar8.m_ptr[3].ob_refcnt & 0xfe;
    goto LAB_0024066f;
  case copy:
    if (copy_constructor == (_func_void_ptr_void_ptr *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&type_name,
                 *(char **)(tinfo->cpptype + 8) + (**(char **)(tinfo->cpptype + 8) == '*'),
                 (allocator<char> *)local_b0[0]._M_local_buf);
      clean_type_id(&type_name);
      pcVar10 = (cast_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_50,"return_value_policy = copy, but type ",&type_name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     &local_50," is non-copyable!");
      cast_error::runtime_error(pcVar10,(string *)local_b0);
      __cxa_throw(pcVar10,&cast_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar9 = (*copy_constructor)(src);
    break;
  case move:
    p_Var11 = local_88;
    if ((local_88 == (_func_void_ptr_void_ptr *)0x0) &&
       (p_Var11 = copy_constructor, copy_constructor == (_func_void_ptr_void_ptr *)0x0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&type_name,
                 *(char **)(tinfo->cpptype + 8) + (**(char **)(tinfo->cpptype + 8) == '*'),
                 (allocator<char> *)local_b0[0]._M_local_buf);
      clean_type_id(&type_name);
      pcVar10 = (cast_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_50,"return_value_policy = move, but type ",&type_name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     &local_50," is neither movable nor copyable!");
      cast_error::runtime_error(pcVar10,(string *)local_b0);
      __cxa_throw(pcVar10,&cast_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar9 = (*p_Var11)(src);
    break;
  case reference_internal:
    *local_58 = src;
    *(byte *)&hVar8.m_ptr[3].ob_refcnt = (byte)hVar8.m_ptr[3].ob_refcnt & 0xfe;
    keep_alive_impl(inst.super_handle.m_ptr,local_90);
    goto LAB_00240672;
  default:
    pcVar10 = (cast_error *)__cxa_allocate_exception(0x10);
    cast_error::runtime_error(pcVar10,"unhandled return_value_policy: should not happen!");
    __cxa_throw(pcVar10,&cast_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *local_58 = pvVar9;
  bVar4 = (byte)hVar8.m_ptr[3].ob_refcnt | 1;
LAB_0024066f:
  *(byte *)&hVar8.m_ptr[3].ob_refcnt = bVar4;
LAB_00240672:
  (*tinfo->init_instance)((instance *)hVar8.m_ptr,existing_holder);
  this = (string *)&inst;
  hVar8 = inst.super_handle.m_ptr;
LAB_0024058e:
  (this->_M_dataplus)._M_p = (pointer)0x0;
  object::~object((object *)this);
  return (handle)hVar8.m_ptr;
}

Assistant:

PYBIND11_NOINLINE static handle cast(const void *_src, return_value_policy policy, handle parent,
                                         const detail::type_info *tinfo,
                                         void *(*copy_constructor)(const void *),
                                         void *(*move_constructor)(const void *),
                                         const void *existing_holder = nullptr) {
        if (!tinfo) // no type info: error will be set already
            return handle();

        void *src = const_cast<void *>(_src);
        if (src == nullptr)
            return none().release();

        auto it_instances = get_internals().registered_instances.equal_range(src);
        for (auto it_i = it_instances.first; it_i != it_instances.second; ++it_i) {
            for (auto instance_type : detail::all_type_info(Py_TYPE(it_i->second))) {
                if (instance_type && same_type(*instance_type->cpptype, *tinfo->cpptype))
                    return handle((PyObject *) it_i->second).inc_ref();
            }
        }

        auto inst = reinterpret_steal<object>(make_new_instance(tinfo->type));
        auto wrapper = reinterpret_cast<instance *>(inst.ptr());
        wrapper->owned = false;
        void *&valueptr = values_and_holders(wrapper).begin()->value_ptr();

        switch (policy) {
            case return_value_policy::automatic:
            case return_value_policy::take_ownership:
                valueptr = src;
                wrapper->owned = true;
                break;

            case return_value_policy::automatic_reference:
            case return_value_policy::reference:
                valueptr = src;
                wrapper->owned = false;
                break;

            case return_value_policy::copy:
                if (copy_constructor)
                    valueptr = copy_constructor(src);
                else {
#if defined(NDEBUG)
                    throw cast_error("return_value_policy = copy, but type is "
                                     "non-copyable! (compile in debug mode for details)");
#else
                    std::string type_name(tinfo->cpptype->name());
                    detail::clean_type_id(type_name);
                    throw cast_error("return_value_policy = copy, but type " +
                                     type_name + " is non-copyable!");
#endif
                }
                wrapper->owned = true;
                break;

            case return_value_policy::move:
                if (move_constructor)
                    valueptr = move_constructor(src);
                else if (copy_constructor)
                    valueptr = copy_constructor(src);
                else {
#if defined(NDEBUG)
                    throw cast_error("return_value_policy = move, but type is neither "
                                     "movable nor copyable! "
                                     "(compile in debug mode for details)");
#else
                    std::string type_name(tinfo->cpptype->name());
                    detail::clean_type_id(type_name);
                    throw cast_error("return_value_policy = move, but type " +
                                     type_name + " is neither movable nor copyable!");
#endif
                }
                wrapper->owned = true;
                break;

            case return_value_policy::reference_internal:
                valueptr = src;
                wrapper->owned = false;
                keep_alive_impl(inst, parent);
                break;

            default:
                throw cast_error("unhandled return_value_policy: should not happen!");
        }

        tinfo->init_instance(wrapper, existing_holder);

        return inst.release();
    }